

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O0

void ffs_internal_convert_field
               (FMFieldPtr src_spec,void *src,FMdata_type dest_type,int dest_size,void *dest)

{
  undefined1 uVar1;
  bool bVar2;
  long lVar3;
  longlong lVar4;
  double dVar5;
  uint in_ECX;
  int iVar6;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  longdouble *in_R8;
  longdouble in_ST0;
  longdouble *dest_field_14;
  double *dest_field_13;
  float *dest_field_12;
  longdouble tmp_5;
  unsigned_long_long *dest_field_11;
  size_t *dest_field_10;
  uint *dest_field_9;
  unsigned_short *dest_field_8;
  uchar *dest_field_7;
  unsigned_long_long tmp_4;
  int *dest_field_6;
  int tmp_3;
  char *dest_field_5;
  char tmp_2;
  longlong lltmp;
  size_t *dest_field_4;
  long *dest_field_3;
  int *dest_field_2;
  short *dest_field_1;
  char *dest_field;
  longlong tmp_1;
  char *srcc_1;
  char tmp;
  char *srcc;
  char *destc;
  int i;
  FMfloat_format reverse_src;
  int float_OK;
  void *in_stack_ffffffffffffff30;
  FMFieldPtr in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  FMFieldPtr in_stack_ffffffffffffff68;
  int local_2c;
  
  bVar2 = true;
  if (in_EDX == 3) {
    if (((char)in_RDI[2] == '\0') &&
       (*(char *)((long)in_RDI + 0x11) != *(char *)((long)in_RDI + 0x12))) {
      bVar2 = false;
    }
    else if (((char)in_RDI[2] != '\0') &&
            (ffs_reverse_float_formats[*(byte *)((long)in_RDI + 0x11)] !=
             (uint)*(byte *)((long)in_RDI + 0x12))) {
      bVar2 = false;
    }
  }
  if ((((in_EDX == 5) || (in_EDX != *(int *)((long)in_RDI + 0xc))) ||
      (in_ECX != *(uint *)(in_RDI + 1))) || (!bVar2)) {
    switch(in_EDX) {
    case 1:
      dVar5 = (double)get_big_int(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (in_ECX == 1) {
        *(char *)in_R8 = SUB81(dVar5,0);
      }
      else if (in_ECX == 2) {
        *(short *)in_R8 = SUB82(dVar5,0);
      }
      else if (in_ECX == 4) {
        *(float *)in_R8 = SUB84(dVar5,0);
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = dVar5;
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = dVar5;
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = dVar5;
      }
      break;
    case 2:
      dVar5 = (double)get_big_unsigned(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (in_ECX == 1) {
        *(char *)in_R8 = SUB81(dVar5,0);
      }
      else if (in_ECX == 2) {
        *(short *)in_R8 = SUB82(dVar5,0);
      }
      else if (in_ECX == 4) {
        *(float *)in_R8 = SUB84(dVar5,0);
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = dVar5;
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = dVar5;
      }
      break;
    case 3:
      get_big_float(in_stack_ffffffffffffff68,
                    (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (in_ECX == 4) {
        *(float *)in_R8 = (float)in_ST0;
      }
      else if (in_ECX == 8) {
        *(double *)in_R8 = (double)in_ST0;
      }
      else if (in_ECX == 0x10) {
        *in_R8 = in_ST0;
      }
      break;
    case 4:
      lVar4 = get_big_int(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      *(char *)in_R8 = (char)lVar4;
      break;
    default:
      break;
    case 6:
    case 7:
      lVar4 = get_big_int(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      *(float *)in_R8 = (float)lVar4;
    }
  }
  else if ((char)in_RDI[2] == '\0') {
    if (in_R8 != (longdouble *)(in_RSI + *in_RDI)) {
      memcpy(in_R8,(longdouble *)(in_RSI + *in_RDI),(long)(int)in_ECX);
    }
  }
  else {
    lVar3 = in_RSI + *in_RDI;
    for (local_2c = 0; iVar6 = (int)in_ECX >> 1, local_2c < iVar6; local_2c = local_2c + 1) {
      uVar1 = *(undefined1 *)(lVar3 + (int)((in_ECX - local_2c) + -1));
      *(undefined1 *)((long)in_R8 + (long)(int)((in_ECX - local_2c) + -1)) =
           *(undefined1 *)(lVar3 + local_2c);
      *(undefined1 *)((long)in_R8 + (long)local_2c) = uVar1;
    }
    if ((in_ECX & 1) != 0) {
      *(undefined1 *)((long)in_R8 + (long)iVar6) = *(undefined1 *)(lVar3 + iVar6);
    }
  }
  return;
}

Assistant:

extern void
ffs_internal_convert_field(FMFieldPtr src_spec, void *src, FMdata_type dest_type, int dest_size, void *dest)
{
    int float_OK = 1;
    if (dest_type == float_type) {
	FMfloat_format reverse_src = 
	    ffs_reverse_float_formats[src_spec->src_float_format];

	if (!src_spec->byte_swap && 
	    src_spec->src_float_format != src_spec->target_float_format) {
	    float_OK = 0;
	} else if (src_spec->byte_swap &&
		   reverse_src != src_spec->target_float_format) {
	    float_OK = 0;
	}
    }		   
    /* quick check to see if it's just a copy... */
    if ((dest_type != string_type) && (dest_type == src_spec->data_type) &&
	(dest_size == src_spec->size) && (float_OK == 1)) {
	if (src_spec->byte_swap) {
	    int i;
	    char *destc = (char *) dest;
	    char *srcc = (char *) src + src_spec->offset;
	    for (i = 0; i < (dest_size >> 1); i++) {
		char tmp = srcc[dest_size - i - 1];
		destc[dest_size - i - 1] = srcc[i];
		destc[i] = tmp;
	    }
	    if ((dest_size & 0x1) != 0) {
		destc[dest_size >> 1] = srcc[dest_size >> 1];
	    }
	} else {
	    char *srcc = (char *) src + src_spec->offset;
	    if (dest != srcc) memcpy(dest, srcc, dest_size);
	}
	return;
    }
    switch (dest_type) {
    case integer_type:
	{
	    MAX_INTEGER_TYPE tmp = get_big_int(src_spec, src);
	    if (dest_size == sizeof(char)) {
		char *dest_field = (char *) dest;
		*dest_field = (char) tmp;
	    } else if (dest_size == sizeof(short)) {
		short *dest_field = (short *) dest;
		*dest_field = (short) tmp;
	    } else if (dest_size == sizeof(int)) {
		int *dest_field = (int *) dest;
		*dest_field = (int) tmp;
	    } else if (dest_size == sizeof(long)) {
		long* dest_field = (long*)dest;
		*dest_field = (long)tmp;
	    } else if (dest_size == sizeof(size_t)) {
		size_t* dest_field = (size_t*)dest;
		*dest_field = (long)tmp;
#if SIZEOF_LONG_LONG != 0
	    } else if (dest_size == sizeof(long long)) {
		long long lltmp = tmp;
		memcpy(dest, &lltmp, sizeof(long long));
#endif
	    }
	    break;
	}
    case char_type:
	{
	    char tmp = (char)get_big_int(src_spec, src);
	    char *dest_field = (char *) dest;
	    *dest_field = tmp;
	    break;
	}
    case boolean_type:
    case enumeration_type:
	{
	    int tmp = (int) get_big_int(src_spec, src);
	    int *dest_field = (int *) dest;
	    *dest_field = tmp;
	    break;
	}
    case unsigned_type:
	{
	    MAX_UNSIGNED_TYPE tmp = get_big_unsigned(src_spec, src);
	    if (dest_size == sizeof(unsigned char)) {
		unsigned char *dest_field = (unsigned char *) dest;
		*dest_field = (unsigned char) tmp;
	    } else if (dest_size == sizeof(unsigned short)) {
		unsigned short *dest_field = (unsigned short *) dest;
		*dest_field = (unsigned short) tmp;
	    } else if (dest_size == sizeof(int)) {
		unsigned int* dest_field = (unsigned int*)dest;
		*dest_field = (unsigned int)tmp;
	    } else if (dest_size == sizeof(size_t)) {
		size_t* dest_field = (size_t*)dest;
		*dest_field = tmp;
#if SIZEOF_LONG_LONG != 0
	    } else if (dest_size == sizeof(long long)) {
		unsigned long long *dest_field = (unsigned long long *) dest;
		*dest_field = tmp;
#endif
	    }
	    break;
	}
    case float_type:
	{
	    MAX_FLOAT_TYPE tmp = get_big_float(src_spec, src);
	    if (dest_size == sizeof(float)) {
		float *dest_field = (float *) dest;
		*dest_field = (float) tmp;
	    } else if (dest_size == sizeof(double)) {
		double *dest_field = (double *) dest;
		*dest_field = tmp;
#if SIZEOF_LONG_DOUBLE != 0
	    } else if (dest_size == sizeof(long double)) {
		long double *dest_field = (long double *) dest;
		*dest_field = tmp;
#endif
	    }
	    break;
	}
    default:
	assert(FALSE);
    }
}